

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

bool kratos::TransformIfCase::has_target_if
               (Stmt *stmt,Var **var,
               vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
               *if_stmts)

{
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  undefined1 local_60 [8];
  shared_ptr<kratos::Var> predicate;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [8];
  shared_ptr<kratos::Expr> expr;
  shared_ptr<kratos::IfStmt> if_;
  
  if (stmt->type_ != If) {
    return 0x10 < (ulong)((long)(if_stmts->
                                super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(if_stmts->
                               super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
  }
  Stmt::as<kratos::IfStmt>
            ((Stmt *)&expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_60,
             (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             (expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             0xc));
  if (*(VarType *)((long)local_60 + 0x168) != Expression) {
    bVar2 = false;
    goto LAB_001d6638;
  }
  Var::as<kratos::Expr>((Var *)local_40);
  if (*(_func_int **)((long)local_40 + 0x270) == (_func_int *)0x19) {
    if (*var == (Var *)0x0) {
      *var = *(Var **)((long)local_40 + 0x278);
    }
    else if (*var != *(Var **)((long)local_40 + 0x278)) goto LAB_001d662d;
    if (((*(int *)(*(_func_int **)((long)local_40 + 0x280) + 0x168) != 3) &&
        (*(int *)(*(_func_int **)((long)local_40 + 0x280) + 0x168) != 5)) ||
       (0x10 < (ulong)((long)expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[0xf]._vptr__Sp_counted_base[0x19] -
                      (long)expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi[0xf]._vptr__Sp_counted_base[0x18])))
    goto LAB_001d662d;
    std::vector<std::shared_ptr<kratos::IfStmt>,std::allocator<std::shared_ptr<kratos::IfStmt>>>::
    emplace_back<std::shared_ptr<kratos::IfStmt>&>
              ((vector<std::shared_ptr<kratos::IfStmt>,std::allocator<std::shared_ptr<kratos::IfStmt>>>
                *)if_stmts,
               (shared_ptr<kratos::IfStmt> *)
               &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    p_Var1 = (__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
             expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [0xf]._vptr__Sp_counted_base[0x18];
    if (p_Var1 == (__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                  expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi[0xf]._vptr__Sp_counted_base[0x19]) {
      bVar2 = true;
    }
    else {
      std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
                 &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 p_Var1);
      bVar2 = has_target_if((Stmt *)predicate.
                                    super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi,var,if_stmts);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    }
  }
  else {
LAB_001d662d:
    bVar2 = false;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expr);
LAB_001d6638:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&predicate);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_);
  return bVar2;
}

Assistant:

bool static has_target_if(Stmt* stmt, Var*& var,
                              std::vector<std::shared_ptr<IfStmt>>& if_stmts) {
        // keep track of which statement are used later to transform into switch statement
        if (stmt->type() != StatementType::If && if_stmts.size() <= 1)
            return false;
        else if (stmt->type() != StatementType::If) {
            // we have reach the end of the if-else chain
            return true;
        }
        auto if_ = stmt->as<IfStmt>();
        auto predicate = if_->predicate();
        // predicate has to be a expression with equal comparison
        if (predicate->type() != VarType::Expression) return false;
        auto expr = predicate->as<Expr>();
        if (expr->op != ExprOp::Eq) return false;
        // has to be the same variable
        if (var == nullptr) {
            var = expr->left;
        } else {
            if (var != expr->left) return false;
        }
        if ((expr->right->type() != VarType::ConstValue) &&
            (expr->right->type() != VarType::Parameter))
            return false;
        if (if_->else_body()->size() > 1) return false;

        if_stmts.emplace_back(if_);
        if (if_->else_body()->empty()) {
            return true;
        } else {
            return has_target_if((*if_->else_body())[0].get(), var, if_stmts);
        }
    }